

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astReturnNode_primitiveAnalyzeAndEvaluate
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t *value;
  sysbvm_tuple_t tuple;
  sysbvm_stackFrameRecord_t *targetRecord;
  sysbvm_tuple_t returnTarget;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_8_1_6971b95b gcFrame;
  sysbvm_astReturnNode_t **returnNode;
  sysbvm_tuple_t *environment;
  sysbvm_tuple_t *node;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  gcFrameRecord.roots = (sysbvm_tuple_t *)0x2f;
  memset(&sourcePositionRecord.sourcePosition,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_FUNCTION_ACTIVATION;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord.sourcePosition);
  returnTarget = 0;
  sourcePositionRecord.previous._0_4_ = 6;
  sourcePositionRecord._8_8_ = *(undefined8 *)(*arguments + 0x10);
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&returnTarget);
  if (*(long *)(*arguments + 0x28) != 0) {
    gcFrameRecord.roots =
         (sysbvm_tuple_t *)
         sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment
                   (context,*(sysbvm_tuple_t *)(*arguments + 0x28),arguments[1]);
  }
  tuple = sysbvm_environment_lookReturnTargetRecursively(context,arguments[1]);
  if (tuple == 0) {
    sysbvm_error("No target available for returning value.");
  }
  value = gcFrameRecord.roots;
  targetRecord = (sysbvm_stackFrameRecord_t *)sysbvm_tuple_uintptr_decode(tuple);
  sysbvm_stackFrame_returnValueInto((sysbvm_tuple_t)value,targetRecord);
  return 0;
}

Assistant:

static sysbvm_tuple_t sysbvm_astReturnNode_primitiveAnalyzeAndEvaluate(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    sysbvm_astReturnNode_t **returnNode = (sysbvm_astReturnNode_t**)node;

    struct {
        sysbvm_tuple_t result;
    } gcFrame = {
        .result = SYSBVM_VOID_TUPLE
    };
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, (*returnNode)->super.sourcePosition);

    if((*returnNode)->expression)
        gcFrame.result = sysbvm_interpreter_analyzeAndEvaluateASTWithEnvironment(context, (*returnNode)->expression, *environment);
    
    sysbvm_tuple_t returnTarget = sysbvm_environment_lookReturnTargetRecursively(context, *environment);
    if(!returnTarget)
        sysbvm_error("No target available for returning value.");

    sysbvm_stackFrame_returnValueInto(gcFrame.result, (sysbvm_stackFrameRecord_t*)sysbvm_tuple_uintptr_decode(returnTarget));
    return SYSBVM_NULL_TUPLE;
}